

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h
# Opt level: O0

void __thiscall
TPZGeoElRefPattern<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>::
MidSideNodeIndex(TPZGeoElRefPattern<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>
                 *this,int side,int64_t *index)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  void *this_00;
  long lVar4;
  TPZGeoElSide *pTVar5;
  TPZGeoEl *pTVar6;
  int64_t iVar7;
  long *plVar8;
  TPZGeoMesh *pTVar9;
  double *pdVar10;
  long *in_RDX;
  int in_ESI;
  TPZGeoEl *in_RDI;
  REAL RVar11;
  REAL aux;
  REAL dif;
  TPZVec<double> auxpt;
  TPZVec<double> centerpt;
  int64_t subnodeindex;
  TPZStack<long,_10> msnindex;
  TPZStack<TPZGeoElSide,_10> subels;
  int nsubel;
  int j;
  int i;
  TPZVec<double> *in_stack_fffffffffffffcf0;
  TPZGeoNode *in_stack_fffffffffffffcf8;
  TPZVec<double> *in_stack_fffffffffffffd00;
  double in_stack_fffffffffffffd08;
  TPZAdmChunkVector<TPZGeoNode,_10> *in_stack_fffffffffffffd10;
  double local_220;
  double local_218;
  undefined1 local_208 [32];
  undefined8 local_1e8;
  TPZVec<double> local_1e0;
  int64_t local_1c0;
  TPZVec<long> local_1b8 [3];
  undefined4 local_148;
  TPZVec<TPZGeoElSide> local_138 [8];
  int local_24;
  int local_20;
  int local_1c;
  long *local_18;
  int local_c;
  
  *in_RDX = -1;
  local_c = in_ESI;
  if ((in_ESI < 0) ||
     (local_18 = in_RDX, iVar1 = (**(code **)(*(long *)in_RDI + 0xf0))(), iVar2 = local_c,
     iVar1 + -1 < in_ESI)) {
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "TPZGeoElRefPattern::MidSideNodeIndex. Bad parameter side = ");
    this_00 = (void *)std::ostream::operator<<(poVar3,local_c);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  else {
    iVar1 = (**(code **)(*(long *)in_RDI + 0x98))();
    if (iVar2 < iVar1) {
      lVar4 = (**(code **)(*(long *)in_RDI + 0xa8))(in_RDI,local_c);
      *local_18 = lVar4;
    }
    else {
      iVar2 = (**(code **)(*(long *)in_RDI + 0x1d0))();
      if (iVar2 != 0) {
        local_24 = (**(code **)(*(long *)in_RDI + 0x150))(in_RDI,local_c);
        TPZStack<TPZGeoElSide,_10>::TPZStack
                  ((TPZStack<TPZGeoElSide,_10> *)in_stack_fffffffffffffd00);
        (**(code **)(*(long *)in_RDI + 0x268))(in_RDI,local_c,local_138);
        if (local_24 == 1) {
          pTVar5 = TPZVec<TPZGeoElSide>::operator[](local_138,0);
          pTVar6 = TPZGeoElSide::Element(pTVar5);
          pTVar5 = TPZVec<TPZGeoElSide>::operator[](local_138,0);
          iVar2 = TPZGeoElSide::Side(pTVar5);
          (**(code **)(*(long *)pTVar6 + 0x118))(pTVar6,iVar2,local_18);
          local_148 = 1;
        }
        else {
          TPZStack<long,_10>::TPZStack((TPZStack<long,_10> *)in_stack_fffffffffffffd00);
          for (local_1c = 0; local_1c < local_24; local_1c = local_1c + 1) {
            pTVar5 = TPZVec<TPZGeoElSide>::operator[](local_138,(long)local_1c);
            iVar2 = TPZGeoElSide::Side(pTVar5);
            pTVar5 = TPZVec<TPZGeoElSide>::operator[](local_138,(long)local_1c);
            pTVar6 = TPZGeoElSide::Element(pTVar5);
            iVar1 = (**(code **)(*(long *)pTVar6 + 0x98))();
            if (iVar2 < iVar1) {
              TPZVec<TPZGeoElSide>::operator[](local_138,(long)local_1c);
              local_1c0 = TPZGeoElSide::SideNodeIndex
                                    ((TPZGeoElSide *)in_stack_fffffffffffffcf8,
                                     (int)((ulong)in_stack_fffffffffffffcf0 >> 0x20));
              TPZStack<long,_10>::Push
                        ((TPZStack<long,_10> *)in_stack_fffffffffffffd00,
                         (long)in_stack_fffffffffffffcf8);
            }
          }
          iVar7 = TPZVec<long>::NElements(local_1b8);
          if (1 < iVar7) {
            poVar3 = std::operator<<((ostream *)&std::cout,
                                     "TPZGeoElRefPattern<TGeo>::MidSideNodeIndex element with more than one midsidenodeindex..."
                                    );
            std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          }
          iVar7 = TPZVec<long>::NElements(local_1b8);
          if (iVar7 == 1) {
            plVar8 = TPZVec<long>::operator[](local_1b8,0);
            *local_18 = *plVar8;
          }
          else {
            iVar7 = TPZVec<long>::NElements(local_1b8);
            if (iVar7 == 0) {
              *local_18 = -1;
            }
            else {
              (**(code **)(*(long *)in_RDI + 0x210))();
              local_1e8 = 0;
              TPZVec<double>::TPZVec
                        (in_stack_fffffffffffffd00,(int64_t)in_stack_fffffffffffffcf8,
                         (double *)in_stack_fffffffffffffcf0);
              (**(code **)(*(long *)in_RDI + 0x210))();
              TPZVec<double>::TPZVec
                        (in_stack_fffffffffffffd00,(int64_t)in_stack_fffffffffffffcf8,
                         (double *)in_stack_fffffffffffffcf0);
              (**(code **)(*(long *)in_RDI + 0x260))(in_RDI,local_c,local_208);
              (**(code **)(*(long *)in_RDI + 0x228))(in_RDI,local_208,&local_1e0);
              local_218 = 1000000.0;
              local_220 = 0.0;
              plVar8 = TPZVec<long>::operator[](local_1b8,0);
              *local_18 = *plVar8;
              for (local_1c = 0; lVar4 = (long)local_1c, iVar7 = TPZVec<long>::NElements(local_1b8),
                  lVar4 < iVar7; local_1c = local_1c + 1) {
                for (local_20 = 0; iVar2 = local_20,
                    iVar1 = (**(code **)(*(long *)in_RDI + 0x210))(), iVar2 < iVar1;
                    local_20 = local_20 + 1) {
                  pTVar9 = TPZGeoEl::Mesh(in_RDI);
                  iVar2 = (int)((ulong)in_stack_fffffffffffffcf0 >> 0x20);
                  TPZGeoMesh::NodeVec(pTVar9);
                  TPZVec<long>::operator[](local_1b8,(long)local_1c);
                  TPZChunkVector<TPZGeoNode,_10>::operator[]
                            (&in_stack_fffffffffffffd10->super_TPZChunkVector<TPZGeoNode,_10>,
                             (int64_t)in_stack_fffffffffffffd08);
                  RVar11 = TPZGeoNode::Coord(in_stack_fffffffffffffcf8,iVar2);
                  pdVar10 = TPZVec<double>::operator[](&local_1e0,(long)local_20);
                  in_stack_fffffffffffffd08 = RVar11 - *pdVar10;
                  pTVar9 = TPZGeoEl::Mesh(in_RDI);
                  in_stack_fffffffffffffd10 = TPZGeoMesh::NodeVec(pTVar9);
                  TPZVec<long>::operator[](local_1b8,(long)local_1c);
                  TPZChunkVector<TPZGeoNode,_10>::operator[]
                            (&in_stack_fffffffffffffd10->super_TPZChunkVector<TPZGeoNode,_10>,
                             (int64_t)in_stack_fffffffffffffd08);
                  in_stack_fffffffffffffcf8 =
                       (TPZGeoNode *)TPZGeoNode::Coord(in_stack_fffffffffffffcf8,iVar2);
                  in_stack_fffffffffffffcf0 =
                       (TPZVec<double> *)TPZVec<double>::operator[](&local_1e0,(long)local_20);
                  local_220 = in_stack_fffffffffffffd08 *
                              ((double)in_stack_fffffffffffffcf8 -
                              (double)in_stack_fffffffffffffcf0->_vptr_TPZVec) + local_220;
                }
                if (local_220 < local_218) {
                  local_218 = local_220;
                  plVar8 = TPZVec<long>::operator[](local_1b8,(long)local_1c);
                  *local_18 = *plVar8;
                }
              }
              TPZVec<double>::~TPZVec(in_stack_fffffffffffffcf0);
              TPZVec<double>::~TPZVec(in_stack_fffffffffffffcf0);
            }
          }
          TPZStack<long,_10>::~TPZStack((TPZStack<long,_10> *)0x17cb735);
          local_148 = 0;
        }
        TPZStack<TPZGeoElSide,_10>::~TPZStack((TPZStack<TPZGeoElSide,_10> *)0x17cb74d);
      }
    }
  }
  return;
}

Assistant:

void TPZGeoElRefPattern<TGeo>::MidSideNodeIndex(int side,int64_t &index) const {
	index = -1;
	int i,j;
	if(side<0 || side>this->NSides()-1) {
		PZError << "TPZGeoElRefPattern::MidSideNodeIndex. Bad parameter side = " << side << std::endl;
		return;
	}
	//corner side
	if(side<this->NCornerNodes()) {//o n�medio do lado 0 �o 0 etc.
		index = this->NodeIndex(side);
		return;
	}
	//o n�medio da face �o centro e o n�medio do centro �o centro
	//como n�de algum filho se este existir
	//caso tenha filhos �o canto de algum filho, se n� tiver filhos retorna -1
	if(HasSubElement()) {
		//side -= NCornerNodes();
		//index =(gel->SubElement(MidSideNodes[side][0]))->NodeIndex(MidSideNodes[side][1]);
		int nsubel = this->NSideSubElements(side);
		TPZStack <TPZGeoElSide> subels;
		GetSubElements2(side,subels);
		// Nao sei porque deve se fazer esta execao
		if (nsubel == 1) {
			subels[0].Element()->MidSideNodeIndex(subels[0].Side(),index);
			return;
		}
		TPZStack <int64_t> msnindex;
		// este sidenodeindex pode nao existir. Normalmente o numero de nos de um elemento e igual
		// NNodes. Quer dizer se o lado e maior igual NNodes, este metodo nao devolvera nada
		
		int64_t subnodeindex;
		for (i=0;i<nsubel;i++){
			if(subels[i].Side() >= subels[i].Element()->NCornerNodes()) continue;
			subnodeindex = subels[i].SideNodeIndex(0);
			msnindex.Push(subnodeindex);
		}
		if(msnindex.NElements() > 1) {
			std::cout << "TPZGeoElRefPattern<TGeo>::MidSideNodeIndex element with more than one midsidenodeindex..." << std::endl;
		}
		if (msnindex.NElements() == 1) index = msnindex[0];
		else if(msnindex.NElements() == 0) {
			index = -1;
		} else {
			TPZVec<REAL> centerpt(this->Dimension(),0.);
			TPZVec<REAL> auxpt(this->Dimension(),0.);
			this->CenterPoint(side,auxpt);
			this->X(auxpt,centerpt);
			
			REAL dif = 1e6;
			REAL aux = 0;
			index = msnindex[0];
			for (i=0;i<msnindex.NElements();i++){
				for (j=0;j<this->Dimension();j++)
					aux += (this->Mesh()->NodeVec()[msnindex[i]].Coord(j) - centerpt[j]) *
                    (this->Mesh()->NodeVec()[msnindex[i]].Coord(j) - centerpt[j]);
				if (aux < dif){
					dif = aux;
					index = msnindex[i];
				}
			}
		}
	}
}